

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktMemoryPipelineBarrierTests.cpp
# Opt level: O1

void __thiscall
vkt::memory::anon_unknown_0::SubmitCommandBuffer::execute
          (SubmitCommandBuffer *this,ExecuteContext *context)

{
  DeviceInterface *pDVar1;
  VkCommandBuffer cmd;
  VkSubmitInfo submit;
  VkCommandBuffer_s *local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 *local_18;
  undefined8 uStack_10;
  undefined8 local_8;
  
  pDVar1 = context->m_context->m_vkd;
  local_50 = (this->m_commandBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object;
  local_18 = &local_50;
  uStack_40 = 0;
  local_28 = 0;
  uStack_10 = 0;
  local_38 = 0;
  uStack_30 = 0;
  local_8 = 0;
  local_48 = 4;
  uStack_20 = 1;
  (*pDVar1->_vptr_DeviceInterface[2])(pDVar1,context->m_context->m_queue,1,&local_48,0);
  return;
}

Assistant:

void SubmitCommandBuffer::execute (ExecuteContext& context)
{
	const vk::DeviceInterface&	vkd		= context.getContext().getDeviceInterface();
	const vk::VkCommandBuffer	cmd		= *m_commandBuffer;
	const vk::VkQueue			queue	= context.getContext().getQueue();
	const vk::VkSubmitInfo		submit	=
	{
		vk::VK_STRUCTURE_TYPE_SUBMIT_INFO,
		DE_NULL,

		0,
		DE_NULL,
		(const vk::VkPipelineStageFlags*)DE_NULL,

		1,
		&cmd,

		0,
		DE_NULL
	};

	vkd.queueSubmit(queue, 1, &submit, 0);
}